

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.h
# Opt level: O3

void __thiscall Ptex::v2_2::PtexWriterBase::getError(PtexWriterBase *this,String *error)

{
  pointer pcVar1;
  char *pcVar2;
  long *plVar3;
  long *plVar4;
  long *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  pcVar1 = (this->_error)._M_dataplus._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar1,pcVar1 + (this->_error)._M_string_length);
  std::__cxx11::string::append((char *)local_68);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_68,(ulong)(this->_path)._M_dataplus._M_p);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_38 = *plVar4;
    lStack_30 = plVar3[3];
    __s = &local_38;
  }
  else {
    local_38 = *plVar4;
    __s = (long *)*plVar3;
  }
  local_40 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pcVar2 = (char *)error->_M_string_length;
  local_48 = __s;
  strlen((char *)__s);
  std::__cxx11::string::_M_replace((ulong)error,0,pcVar2,(ulong)__s);
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return;
}

Assistant:

void getError(Ptex::String& error) {
        error = (_error + "\nPtex file: " + _path).c_str();
    }